

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  _union_1457 _Var2;
  char cVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int *piVar8;
  void *__addr;
  undefined8 *puVar9;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  ulong *local_310;
  size_type local_308;
  ulong local_300;
  long lStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_210;
  int local_20c;
  string local_208;
  int local_1e4;
  string local_1e0;
  size_type *local_1c0;
  size_type local_1b8;
  size_type local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [8];
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  size_type local_b8;
  ulong uStack_b0;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1e4 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_210);
  if (iVar4 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*plVar6;
    psVar13 = (size_type *)(plVar6 + 2);
    if (local_310 == psVar13) {
      local_300 = *psVar13;
      lStack_2f8 = plVar6[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *psVar13;
    }
    local_308 = plVar6[1];
    *plVar6 = (long)psVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if (local_2d0 == paVar14) {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2c0._8_8_ = plVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2c8 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x589;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar18 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar18 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_290._M_string_length + local_2c8) {
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar18 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_290._M_string_length + local_2c8) goto LAB_001434fc;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_290,0,0,local_2d0->_M_local_buf,local_2c8);
    }
    else {
LAB_001434fc:
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar14 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar7->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_c8.sa_handler = (__sighandler_t)*puVar9;
    p_Var11 = (__sighandler_t)(puVar9 + 2);
    if (local_c8.sa_handler == p_Var11) {
      local_b8 = *(size_type *)p_Var11;
      uStack_b0 = puVar9[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(size_type *)p_Var11;
    }
    local_c0 = (undefined1  [8])puVar9[1];
    *puVar9 = p_Var11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*puVar9;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler == paVar14) {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_150[0]._8_8_ = puVar9[3];
      local_160.sa_handler = (__sighandler_t)local_150;
    }
    else {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_158 = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort((string *)&local_160);
    puVar9 = extraout_RAX_02;
    local_160 = extraout_RDX_02;
LAB_00143f49:
    local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
  }
  else {
    iVar4 = fcntl(local_20c,2,0);
    if (iVar4 != -1) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = plVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
        local_310 = (ulong *)*plVar6;
      }
      local_308 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2c0._8_8_ = plVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_2c8 = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_c8.sa_handler = (__sighandler_t)&local_b8;
      p_Var11 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var11) {
        local_b8 = *(size_type *)p_Var11;
        uStack_b0 = plVar6[3];
      }
      else {
        local_b8 = *(size_type *)p_Var11;
        local_c8.sa_handler = (__sighandler_t)*plVar6;
      }
      local_c0 = (undefined1  [8])plVar6[1];
      *plVar6 = (long)p_Var11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_150[0]._8_8_ = plVar6[3];
        local_160.sa_handler = (__sighandler_t)local_150;
      }
      else {
        local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_160.sa_handler = (__sighandler_t)*plVar6;
      }
      local_158 = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_180 = &local_170;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_170 = *plVar12;
        lStack_168 = plVar6[3];
      }
      else {
        local_170 = *plVar12;
        local_180 = (long *)*plVar6;
      }
      local_178 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
        operator_delete(local_c8.sa_handler,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_270.field_2._M_allocated_capacity = *puVar10;
        local_270.field_2._8_8_ = plVar6[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar10;
        local_270._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_270._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2e0._8_8_ = plVar6[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_2e8 = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = plVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
        local_310 = (ulong *)*plVar6;
      }
      local_308 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_208,&this->line_);
      uVar17 = 0xf;
      if (local_310 != &local_300) {
        uVar17 = local_300;
      }
      if (uVar17 < local_208._M_string_length + local_308) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar18 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_208._M_string_length + local_308) goto LAB_00142048;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_208,0,0,(char *)local_310,local_308);
      }
      else {
LAB_00142048:
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_310,(ulong)local_208._M_dataplus._M_p);
      }
      local_2d0 = &local_2c0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar7->_M_dataplus)._M_p;
      paVar14 = &pbVar7->field_2;
      if (paVar15 == paVar14) {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2c0._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2d0 = paVar15;
      }
      local_2c8 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar7->_M_string_length = 0;
      paVar14->_M_local_buf[0] = '\0';
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_1e0,&local_1e4);
      uVar17 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
               local_2b0._M_string_length;
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar18 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < uVar17) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar18 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < uVar17) goto LAB_00142170;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1e0,0,0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
      }
      else {
LAB_00142170:
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_1e0._M_dataplus._M_p);
      }
      local_c8.sa_handler = (__sighandler_t)&local_b8;
      _Var2.sa_handler = (__sighandler_t)(pbVar7->_M_dataplus)._M_p;
      paVar14 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2.sa_handler == paVar14) {
        local_b8 = paVar14->_M_allocated_capacity;
        uStack_b0 = *(ulong *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_b8 = paVar14->_M_allocated_capacity;
        local_c8.sa_handler = _Var2.sa_handler;
      }
      local_c0 = (undefined1  [8])pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar7->_M_string_length = 0;
      paVar14->_M_local_buf[0] = '\0';
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar14) {
        local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_150[0]._8_8_ = plVar6[3];
        local_160.sa_handler = (__sighandler_t)local_150;
      }
      else {
        local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_160.sa_handler = (__sighandler_t)*plVar6;
      }
      local_158 = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_1a0,&local_20c);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        uVar18 = local_150[0]._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_158 + local_1a0._M_string_length) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar18 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_158 + local_1a0._M_string_length) goto LAB_001422b7;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1a0,0,0,(char *)local_160.sa_handler,local_158);
      }
      else {
LAB_001422b7:
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_160,
                            CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                     local_1a0._M_dataplus._M_p._0_4_));
      }
      local_1c0 = &local_1b0;
      psVar13 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar14 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13 == paVar14) {
        local_1b0 = paVar14->_M_allocated_capacity;
        uStack_1a8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_1b0 = paVar14->_M_allocated_capacity;
        local_1c0 = psVar13;
      }
      local_1b8 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar7->_M_string_length = 0;
      paVar14->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                        local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
        operator_delete(local_c8.sa_handler,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)&local_208);
      GetInjectableArgvs_abi_cxx11_();
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_160);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_160.sa_handler = (__sighandler_t)strdup((char *)local_180);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_160.sa_handler);
      local_160.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_160.sa_handler);
      local_160.sa_handler = (__sighandler_t)local_150;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.sa_handler != local_150) {
        operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_210;
      memset(&local_c8,0,0x98);
      sigemptyset((sigset_t *)local_c0);
      local_c8 = (_union_1457)0x1;
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_160);
        cVar3 = FLAGS_gtest_death_test_use_fork;
        if (iVar4 != -1) {
          iVar4 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            iVar4 = getpagesize();
            __len = (size_t)(iVar4 * 2);
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_250,"CHECK failed: File ","");
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
              local_290._M_dataplus._M_p = (pointer)*puVar9;
              puVar10 = puVar9 + 2;
              if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
                local_290.field_2._M_allocated_capacity = *puVar10;
                local_290.field_2._8_8_ = puVar9[3];
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              }
              else {
                local_290.field_2._M_allocated_capacity = *puVar10;
              }
              local_290._M_string_length = puVar9[1];
              *puVar9 = puVar10;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
              local_2f0 = &local_2e0;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar9;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar9 + 2);
              if (paVar14 != paVar15) goto LAB_0014383a;
              local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_2e0._8_8_ = puVar9[3];
              goto LAB_00143847;
            }
            lVar16 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar16 = __len - 0x40;
            }
            if ((0x40 < (uint)(iVar4 * 2)) && (((ulong)(lVar16 + (long)__addr) & 0x3f) == 0)) {
              iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar16 + (long)__addr),0x11,&local_1e0);
              iVar5 = munmap(__addr,__len);
              if (iVar5 != -1) goto LAB_00142765;
              goto LAB_00142eb1;
            }
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_290._M_dataplus._M_p = (pointer)*puVar9;
            puVar10 = puVar9 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
              local_290.field_2._M_allocated_capacity = *puVar10;
              local_290.field_2._8_8_ = puVar9[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar10;
            }
            local_290._M_string_length = puVar9[1];
            *puVar9 = puVar10;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar9;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if (local_2f0 == paVar14) {
              local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2e0._8_8_ = puVar9[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
            }
            local_2e8 = puVar9[1];
            *puVar9 = paVar14;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            local_230._M_dataplus._M_p._0_4_ = 0x560;
            StreamableToString<int>(&local_270,(int *)&local_230);
            uVar18 = 0xf;
            if (local_2f0 != &local_2e0) {
              uVar18 = local_2e0._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_270._M_string_length + local_2e8) {
              uVar18 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != &local_270.field_2) {
                uVar18 = local_270.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < local_270._M_string_length + local_2e8) goto LAB_0014397f;
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_270,0,0,local_2f0->_M_local_buf,local_2e8);
            }
            else {
LAB_0014397f:
              pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
            }
            local_310 = (ulong *)(pbVar7->_M_dataplus)._M_p;
            paVar14 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310 == paVar14) {
              local_300 = paVar14->_M_allocated_capacity;
              lStack_2f8 = *(long *)((long)&pbVar7->field_2 + 8);
              local_310 = &local_300;
            }
            else {
              local_300 = paVar14->_M_allocated_capacity;
            }
            local_308 = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
            pbVar7->_M_string_length = 0;
            paVar14->_M_local_buf[0] = '\0';
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar9;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if (local_2d0 == paVar14) {
              local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2c0._8_8_ = puVar9[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
            }
            local_2c8 = puVar9[1];
            *puVar9 = paVar14;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar9 + 2);
            if (paVar14 != paVar15) goto LAB_00144102;
            local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar9[3];
            goto LAB_0014410f;
          }
LAB_00142765:
          if ((cVar3 == '\0') || (iVar4 = fork(), iVar4 != 0)) {
            goto LAB_00142781;
          }
          ExecDeathTestChildMain(&local_1e0);
LAB_00142eb1:
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_dataplus._M_p = (pointer)*puVar9;
          puVar10 = puVar9 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
            local_290.field_2._M_allocated_capacity = *puVar10;
            local_290.field_2._8_8_ = puVar9[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar10;
          }
          local_290._M_string_length = puVar9[1];
          *puVar9 = puVar10;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if (local_2f0 == paVar14) {
            local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2e0._8_8_ = puVar9[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_2e8 = puVar9[1];
          *puVar9 = paVar14;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x564;
          StreamableToString<int>(&local_270,(int *)&local_230);
          uVar18 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar18 = local_2e0._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_270._M_string_length + local_2e8) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar18 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_270._M_string_length + local_2e8) goto LAB_00143a2d;
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_270,0,0,local_2f0->_M_local_buf,local_2e8);
          }
          else {
LAB_00143a2d:
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)(pbVar7->_M_dataplus)._M_p;
          paVar14 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310 == paVar14) {
            local_300 = paVar14->_M_allocated_capacity;
            lStack_2f8 = *(long *)((long)&pbVar7->field_2 + 8);
            local_310 = &local_300;
          }
          else {
            local_300 = paVar14->_M_allocated_capacity;
          }
          local_308 = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar7->_M_string_length = 0;
          paVar14->_M_local_buf[0] = '\0';
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if (local_2d0 == paVar14) {
            local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2c0._8_8_ = puVar9[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_2c8 = puVar9[1];
          *puVar9 = paVar14;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if (paVar14 != paVar15) goto LAB_00144130;
          local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar9[3];
          goto LAB_0014413d;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_250._M_dataplus._M_p = (pointer)*plVar6;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250.field_2._8_8_ = plVar6[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar10;
      }
      local_250._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar6;
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = plVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
      }
      local_290._M_string_length = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1a0._M_dataplus._M_p._0_4_ = 0x546;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar18 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar18 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_00142b08;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_230,0,0,local_290._M_dataplus._M_p,local_290._M_string_length);
      }
      else {
LAB_00142b08:
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
      }
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar7->_M_dataplus)._M_p;
      paVar14 = &pbVar7->field_2;
      if (local_2f0 == paVar14) {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2e0._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2e8 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar7->_M_string_length = 0;
      paVar14->_M_local_buf[0] = '\0';
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar9;
      puVar10 = puVar9 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar9[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar9[1];
      *puVar9 = puVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if (local_2d0 == paVar14) {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2c0._8_8_ = plVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2c8 = plVar6[1];
      *plVar6 = (long)paVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar9;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar9[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar9[1];
      *puVar9 = paVar15;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar9 = extraout_RAX;
      paVar14 = extraout_RDX;
      goto LAB_001437d5;
    }
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar9;
    psVar13 = puVar9 + 2;
    if (local_310 == psVar13) {
      local_300 = *psVar13;
      lStack_2f8 = puVar9[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *psVar13;
    }
    local_308 = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if (local_2d0 == paVar14) {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2c0._8_8_ = puVar9[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2c8 = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar18 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar18 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_290._M_string_length + local_2c8) {
      uVar18 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar18 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_290._M_string_length + local_2c8) goto LAB_001435a1;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_290,0,0,local_2d0->_M_local_buf,local_2c8);
    }
    else {
LAB_001435a1:
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar14 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar7->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_c8.sa_handler = (__sighandler_t)*puVar9;
    p_Var11 = (__sighandler_t)(puVar9 + 2);
    if (local_c8.sa_handler == p_Var11) {
      local_b8 = *(size_type *)p_Var11;
      uStack_b0 = puVar9[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(size_type *)p_Var11;
    }
    local_c0 = (undefined1  [8])puVar9[1];
    *puVar9 = p_Var11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*puVar9;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler != paVar14) goto LAB_00143f49;
    local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_150[0]._8_8_ = puVar9[3];
    local_160.sa_handler = (__sighandler_t)local_150;
  }
  local_158 = puVar9[1];
  *puVar9 = paVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  puVar9 = extraout_RAX_03;
  local_2d0 = extraout_RDX_03;
  goto LAB_00143f80;
LAB_00142818:
  do {
    iVar5 = close(local_20c);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_210;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if (local_2f0 == paVar14) {
    local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2e0._8_8_ = plVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2e8 = plVar6[1];
  *plVar6 = (long)paVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*plVar6;
  puVar10 = (ulong *)(plVar6 + 2);
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x5a3;
  StreamableToString<int>(&local_250,(int *)&local_270);
  uVar17 = 0xf;
  if (local_310 != &local_300) {
    uVar17 = local_300;
  }
  if (uVar17 < local_250._M_string_length + local_308) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar18 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_250._M_string_length + local_308) goto LAB_00142c7f;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_250,0,0,(char *)local_310,local_308);
  }
  else {
LAB_00142c7f:
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar7->_M_dataplus)._M_p;
  paVar14 = &pbVar7->field_2;
  if (local_2d0 == paVar14) {
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2c0._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2c8 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar7->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*plVar6;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar14) {
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = plVar6[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2b0._M_string_length = plVar6[1];
  *plVar6 = (long)paVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_c8.sa_handler = (__sighandler_t)*plVar6;
  p_Var11 = (__sighandler_t)(plVar6 + 2);
  if (local_c8.sa_handler == p_Var11) {
    local_b8 = *(size_type *)p_Var11;
    uStack_b0 = plVar6[3];
    local_c8.sa_handler = (__sighandler_t)&local_b8;
  }
  else {
    local_b8 = *(size_type *)p_Var11;
  }
  local_c0 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
  local_160.sa_handler = (__sighandler_t)*puVar9;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != paVar15) goto LAB_00143803;
  local_150[0]._0_8_ = paVar15->_M_allocated_capacity;
  local_150[0]._8_8_ = puVar9[3];
  local_160.sa_handler = (__sighandler_t)local_150;
  goto LAB_00143816;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00142781:
    iVar5 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar4 != -1) goto LAB_00142818;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*puVar9;
      puVar10 = puVar9 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = puVar9[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
      }
      local_290._M_string_length = puVar9[1];
      *puVar9 = puVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if (local_2f0 == paVar14) {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2e0._8_8_ = puVar9[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2e8 = puVar9[1];
      *puVar9 = paVar14;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x574;
      StreamableToString<int>(&local_270,(int *)&local_230);
      uVar18 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar18 = local_2e0._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_270._M_string_length + local_2e8) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar18 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_270._M_string_length + local_2e8) goto LAB_00143790;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_270,0,0,local_2f0->_M_local_buf,local_2e8);
      }
      else {
LAB_00143790:
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
      }
      local_310 = (ulong *)(pbVar7->_M_dataplus)._M_p;
      paVar14 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310 == paVar14) {
        local_300 = paVar14->_M_allocated_capacity;
        lStack_2f8 = *(long *)((long)&pbVar7->field_2 + 8);
        local_310 = &local_300;
      }
      else {
        local_300 = paVar14->_M_allocated_capacity;
      }
      local_308 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar7->_M_string_length = 0;
      paVar14->_M_local_buf[0] = '\0';
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar9 + 2);
      if (local_2d0 == paVar14) {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2c0._8_8_ = puVar9[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2c8 = puVar9[1];
      *puVar9 = paVar14;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar6[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_2b0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar9 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_001440d4;
    }
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar9;
  puVar10 = puVar9 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = puVar9[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
  }
  local_250._M_string_length = puVar9[1];
  *puVar9 = puVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*puVar9;
  puVar10 = puVar9 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
    local_290.field_2._M_allocated_capacity = *puVar10;
    local_290.field_2._8_8_ = puVar9[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar10;
  }
  local_290._M_string_length = puVar9[1];
  *puVar9 = puVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x571;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar18 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar18 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_230._M_string_length + local_290._M_string_length) goto LAB_00142bce;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_230,0,0,local_290._M_dataplus._M_p,local_290._M_string_length);
  }
  else {
LAB_00142bce:
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar7->_M_dataplus)._M_p;
  paVar14 = &pbVar7->field_2;
  if (local_2f0 == paVar14) {
    local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2e0._8_8_ = *(long *)((long)&pbVar7->field_2 + 8);
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2e8 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar7->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar9;
  puVar10 = puVar9 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar9[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar9[1];
  *puVar9 = puVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if (local_2d0 == paVar14) {
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2c8 = puVar9[1];
  *puVar9 = paVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if (paVar14 == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
  }
  else {
LAB_001437d5:
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar14;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar9 = extraout_RAX_00;
  local_160 = extraout_RDX_00;
LAB_00143803:
  local_150[0]._0_8_ = paVar15->_M_allocated_capacity;
LAB_00143816:
  local_158 = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)&local_160);
  puVar9 = extraout_RAX_01;
  paVar14 = extraout_RDX_01;
LAB_0014383a:
  local_2e0._M_allocated_capacity = paVar15->_M_allocated_capacity;
  local_2f0 = paVar14;
LAB_00143847:
  local_2e8 = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x552;
  StreamableToString<int>(&local_270,(int *)&local_230);
  uVar18 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar18 = local_2e0._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_270._M_string_length + local_2e8) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar18 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_270._M_string_length + local_2e8) goto LAB_001438d1;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_270,0,0,local_2f0->_M_local_buf,local_2e8);
  }
  else {
LAB_001438d1:
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
  }
  local_310 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar14 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310 == paVar14) {
    local_300 = paVar14->_M_allocated_capacity;
    lStack_2f8 = *(long *)((long)&pbVar7->field_2 + 8);
    local_310 = &local_300;
  }
  else {
    local_300 = paVar14->_M_allocated_capacity;
  }
  local_308 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar7->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if (local_2d0 == paVar14) {
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2c0._8_8_ = puVar9[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_00143f80:
    local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2c8 = puVar9[1];
  *puVar9 = paVar14;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar9;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar15) {
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar9[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_001440d4:
    local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar9 = extraout_RAX_05;
  paVar14 = extraout_RDX_05;
LAB_00144102:
  local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar14;
LAB_0014410f:
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar9 = extraout_RAX_06;
  paVar14 = extraout_RDX_06;
LAB_00144130:
  local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar14;
LAB_0014413d:
  local_2b0._M_string_length = puVar9[1];
  *puVar9 = paVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170 + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}